

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lyd_parser_notif_eventtime_validate(lyd_node *node)

{
  ly_ctx *ctx;
  lysp_tpdf *plVar1;
  lysc_node *plVar2;
  ly_ctx *ctx_00;
  uint16_t *puVar3;
  lysc_pattern **patterns_00;
  int iVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  ulong uVar9;
  lysc_node *plVar10;
  lyd_node *plVar11;
  size_t sVar12;
  lysc_pattern *plVar13;
  ulong uVar14;
  lysp_type *plVar15;
  long lVar16;
  uint64_t c__;
  lysc_pattern *plVar17;
  lysc_pattern **patterns;
  ly_err_item *err;
  lysc_ctx cctx;
  lysc_pattern **local_10e0;
  ly_err_item *local_10d8;
  lysc_ctx local_10d0;
  
  if (node->schema == (lysc_node *)0x0) {
    plVar7 = (lys_module *)&node[2].schema;
  }
  else {
    plVar7 = node->schema->module;
  }
  ctx = plVar7->ctx;
  memset(&local_10d0,0,0x10a0);
  local_10d8 = (ly_err_item *)0x0;
  local_10e0 = (lysc_pattern **)0x0;
  plVar7 = ly_ctx_get_module_implemented(ctx,"notifications");
  plVar8 = ly_ctx_get_module_latest(ctx,"ietf-yang-types");
  if (plVar8 == (lys_module *)0x0) {
    __assert_fail("mod2",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x57,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
  }
  if ((plVar7 == (lys_module *)0x0) && (plVar8->parsed != (lysp_module *)0x0)) {
    local_10d0.path_len = 1;
    local_10d0.path[0] = '/';
    plVar1 = plVar8->parsed->typedefs;
    plVar15 = &plVar1[-1].type;
    uVar14 = 0xffffffffffffffff;
    local_10d0.ctx = ctx;
    local_10d0.free_ctx.ctx = ctx;
    do {
      if (plVar1 == (lysp_tpdf *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(ulong *)&plVar1[-1].flags;
      }
      uVar14 = uVar14 + 1;
      if (uVar9 <= uVar14) {
        plVar15 = (lysp_type *)0x0;
        break;
      }
      puVar3 = (uint16_t *)(plVar15 + 1);
      plVar15 = (lysp_type *)((long)(plVar15 + 1) + 0x48);
      iVar4 = strcmp(*(char **)(puVar3 + 4),"date-and-time");
    } while (iVar4 != 0);
    if (plVar15 == (lysp_type *)0x0) {
      __assert_fail("type_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                    ,0x6b,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
    }
    if (*(lysp_restr **)((long)plVar15 + 0x18) == (lysp_restr *)0x0) {
      __assert_fail("type_p->patterns",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                    ,0x6e,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
    }
    LVar5 = lys_compile_type_patterns
                      (&local_10d0,*(lysp_restr **)((long)plVar15 + 0x18),(lysc_pattern **)0x0,
                       &local_10e0);
    if (LVar5 != LY_SUCCESS) goto LAB_001683f6;
    if (node == (lyd_node *)0x0) {
LAB_001683ca:
      plVar11 = (lyd_node *)0x0;
    }
    else {
      plVar10 = node->schema;
      if (plVar10 == (lysc_node *)0x0) {
        plVar11 = node[1].prev;
      }
      else {
        if ((plVar10->nodetype & 0xc) == 0) goto LAB_001683ca;
        plVar11 = *(lyd_node **)(node + 1);
        if (plVar11 == (lyd_node *)0x0) {
          plVar11 = (lyd_node *)
                    lyd_value_get_canonical(plVar10->module->ctx,(lyd_value *)(node + 1));
        }
      }
    }
    patterns_00 = local_10e0;
    sVar12 = strlen((char *)plVar11);
    LVar5 = lyplg_type_validate_patterns(patterns_00,(char *)plVar11,sVar12,&local_10d8);
    goto LAB_001683f6;
  }
  if (node->schema == (lysc_node *)0x0) {
    plVar7 = (lys_module *)&node[2].schema;
  }
  else {
    plVar7 = node->schema->module;
  }
  plVar10 = lys_find_path(plVar7->ctx,(lysc_node *)0x0,"/notifications:notification/eventTime",'\0')
  ;
  if (plVar10 == (lysc_node *)0x0) {
    return LY_ENOTFOUND;
  }
  if (node == (lyd_node *)0x0) {
LAB_0016830d:
    plVar11 = (lyd_node *)0x0;
  }
  else {
    plVar2 = node->schema;
    if (plVar2 == (lysc_node *)0x0) {
      plVar11 = node[1].prev;
    }
    else {
      if ((plVar2->nodetype & 0xc) == 0) goto LAB_0016830d;
      plVar11 = *(lyd_node **)(node + 1);
      if (plVar11 == (lyd_node *)0x0) {
        plVar11 = (lyd_node *)lyd_value_get_canonical(plVar2->module->ctx,(lyd_value *)(node + 1));
      }
    }
  }
  if (node->schema == (lysc_node *)0x0) {
    plVar7 = (lys_module *)&node[2].schema;
  }
  else {
    plVar7 = node->schema->module;
  }
  ctx_00 = plVar7->ctx;
  sVar12 = strlen((char *)plVar11);
  LVar5 = LY_SUCCESS;
  LVar6 = lyd_value_validate(ctx_00,plVar10,(char *)plVar11,sVar12,(lyd_node *)0x0,(lysc_type **)0x0
                             ,(char **)0x0);
  if (LVar6 != LY_SUCCESS) {
    return LVar6;
  }
LAB_001683f6:
  lVar16 = 0;
  plVar17 = (lysc_pattern *)0x0;
  while( true ) {
    if (local_10e0 == (lysc_pattern **)0x0) {
      plVar13 = (lysc_pattern *)0x0;
    }
    else {
      plVar13 = local_10e0[-1];
    }
    if (plVar13 <= plVar17) break;
    lysc_pattern_free(&local_10d0.free_ctx,(lysc_pattern **)((long)local_10e0 + lVar16));
    plVar17 = (lysc_pattern *)((long)&plVar17->expr + 1);
    lVar16 = lVar16 + 8;
  }
  if (local_10e0 != (lysc_pattern **)0x0) {
    free(local_10e0 + -1);
  }
  if (local_10d8 != (ly_err_item *)0x0 && LVar5 != LY_SUCCESS) {
    ly_err_print(ctx,local_10d8);
    ly_err_free(local_10d8);
    ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Invalid \"eventTime\" in the notification.");
  }
  return LVar5;
}

Assistant:

LY_ERR
lyd_parser_notif_eventtime_validate(const struct lyd_node *node)
{
    LY_ERR rc = LY_SUCCESS;
    struct ly_ctx *ctx = (struct ly_ctx *)LYD_CTX(node);
    struct lysc_ctx cctx = {0};
    const struct lys_module *mod1, *mod2;
    const struct lysc_node *schema;
    LY_ARRAY_COUNT_TYPE u;
    struct ly_err_item *err = NULL;
    struct lysp_type *type_p = NULL;
    struct lysc_pattern **patterns = NULL;
    const char *value;

    /* find the used modules, we will either use a compiled leaf or compile the relevant type ourselves */
    mod1 = ly_ctx_get_module_implemented(ctx, "notifications");
    mod2 = ly_ctx_get_module_latest(ctx, "ietf-yang-types");
    assert(mod2);

    if (mod1 || !mod2->parsed) {
        /* get date-and-time leaf */
        schema = lys_find_path(LYD_CTX(node), NULL, "/notifications:notification/eventTime", 0);
        LY_CHECK_RET(!schema, LY_ENOTFOUND);

        /* validate the value */
        value = lyd_get_value(node);
        LY_CHECK_RET(lyd_value_validate(LYD_CTX(node), schema, value, strlen(value), NULL, NULL, NULL));
    } else {
        LYSC_CTX_INIT_CTX(cctx, ctx);

        /* get date-and-time parsed type */
        LY_ARRAY_FOR(mod2->parsed->typedefs, u) {
            if (!strcmp(mod2->parsed->typedefs[u].name, "date-and-time")) {
                type_p = &mod2->parsed->typedefs[u].type;
                break;
            }
        }
        assert(type_p);

        /* compile patterns */
        assert(type_p->patterns);
        LY_CHECK_GOTO(rc = lys_compile_type_patterns(&cctx, type_p->patterns, NULL, &patterns), cleanup);

        /* validate */
        value = lyd_get_value(node);
        rc = lyplg_type_validate_patterns(patterns, value, strlen(value), &err);
    }

cleanup:
    FREE_ARRAY(&cctx.free_ctx, patterns, lysc_pattern_free);
    if (rc && err) {
        ly_err_print(ctx, err);
        ly_err_free(err);
        LOGVAL(ctx, LYVE_DATA, "Invalid \"eventTime\" in the notification.");
    }
    return rc;
}